

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void vdbePmaWriteBlob(PmaWriter *p,u8 *pData,int nData)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar2 = nData;
  while ((0 < iVar2 && (p->eFWErr == 0))) {
    iVar4 = p->nBuffer - p->iBufEnd;
    if (iVar2 < iVar4) {
      iVar4 = iVar2;
    }
    memcpy(p->aBuffer + p->iBufEnd,pData + (nData - iVar2),(long)iVar4);
    iVar3 = iVar4 + p->iBufEnd;
    p->iBufEnd = iVar3;
    if (iVar3 == p->nBuffer) {
      iVar1 = p->iBufStart;
      iVar3 = (*p->pFd->pMethods->xWrite)
                        (p->pFd,p->aBuffer + iVar1,iVar3 - iVar1,(long)iVar1 + p->iWriteOff);
      p->eFWErr = iVar3;
      p->iBufStart = 0;
      p->iBufEnd = 0;
      p->iWriteOff = p->iWriteOff + (long)p->nBuffer;
    }
    iVar2 = iVar2 - iVar4;
  }
  return;
}

Assistant:

static void vdbePmaWriteBlob(PmaWriter *p, u8 *pData, int nData){
  int nRem = nData;
  while( nRem>0 && p->eFWErr==0 ){
    int nCopy = nRem;
    if( nCopy>(p->nBuffer - p->iBufEnd) ){
      nCopy = p->nBuffer - p->iBufEnd;
    }

    memcpy(&p->aBuffer[p->iBufEnd], &pData[nData-nRem], nCopy);
    p->iBufEnd += nCopy;
    if( p->iBufEnd==p->nBuffer ){
      p->eFWErr = sqlite3OsWrite(p->pFd,
          &p->aBuffer[p->iBufStart], p->iBufEnd - p->iBufStart,
          p->iWriteOff + p->iBufStart
      );
      p->iBufStart = p->iBufEnd = 0;
      p->iWriteOff += p->nBuffer;
    }
    assert( p->iBufEnd<p->nBuffer );

    nRem -= nCopy;
  }
}